

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void __thiscall Section::~Section(Section *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::~string((string *)&this->m_right);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::~string((string *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

Section(const std::string& left, const std::string& right)
        : m_left{left}, m_right{right} {}